

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
               (DataStream *s,
               ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *args
               )

{
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  SizeComputer local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.nSize = 0;
  ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>::
  Serialize<SizeComputer>(args,&local_28);
  WriteCompactSize<DataStream>(s,local_28.nSize);
  ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>::
  Serialize<DataStream>(args,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}